

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O0

void CALC_FCSLOT(OPL3_CH *CH,OPL3_SLOT *SLOT)

{
  uint uVar1;
  int ksr;
  OPL3_SLOT *SLOT_local;
  OPL3_CH *CH_local;
  
  SLOT->Incr = CH->fc * (uint)SLOT->mul;
  uVar1 = (int)(uint)CH->kcode >> (SLOT->KSR & 0x1f);
  if (SLOT->ksr != uVar1) {
    SLOT->ksr = (UINT8)uVar1;
    if (SLOT->ar + (uint)SLOT->ksr < 0x4c) {
      SLOT->eg_sh_ar = ""[SLOT->ar + (uint)SLOT->ksr];
      SLOT->eg_m_ar = (1 << (SLOT->eg_sh_ar & 0x1f)) - 1;
      SLOT->eg_sel_ar = "pppppppppppppppp"[SLOT->ar + (uint)SLOT->ksr];
    }
    else {
      SLOT->eg_sh_ar = '\0';
      SLOT->eg_m_ar = (1 << (SLOT->eg_sh_ar & 0x1f)) - 1;
      SLOT->eg_sel_ar = 'h';
    }
    SLOT->eg_sh_dr = ""[SLOT->dr + (uint)SLOT->ksr];
    SLOT->eg_m_dr = (1 << (SLOT->eg_sh_dr & 0x1f)) - 1;
    SLOT->eg_sel_dr = "pppppppppppppppp"[SLOT->dr + (uint)SLOT->ksr];
    SLOT->eg_sh_rr = ""[SLOT->rr + (uint)SLOT->ksr];
    SLOT->eg_m_rr = (1 << (SLOT->eg_sh_rr & 0x1f)) - 1;
    SLOT->eg_sel_rr = "pppppppppppppppp"[SLOT->rr + (uint)SLOT->ksr];
  }
  return;
}

Assistant:

INLINE void CALC_FCSLOT(OPL_CH *CH,OPL_SLOT *SLOT)
{
	int ksr;

	/* (frequency) phase increment counter */
	SLOT->Incr = CH->fc * SLOT->mul;
	ksr = CH->kcode >> SLOT->KSR;

	if( SLOT->ksr != ksr )
	{
		SLOT->ksr = ksr;

		/* calculate envelope generator rates */
		if ((SLOT->ar + SLOT->ksr) < 16+62)
		{
			SLOT->eg_sh_ar  = eg_rate_shift [SLOT->ar + SLOT->ksr ];
			SLOT->eg_sel_ar = eg_rate_select[SLOT->ar + SLOT->ksr ];
		}
		else
		{
			SLOT->eg_sh_ar  = 0;
			SLOT->eg_sel_ar = 13*RATE_STEPS;
		}
		SLOT->eg_sh_dr  = eg_rate_shift [SLOT->dr + SLOT->ksr ];
		SLOT->eg_sel_dr = eg_rate_select[SLOT->dr + SLOT->ksr ];
		SLOT->eg_sh_rr  = eg_rate_shift [SLOT->rr + SLOT->ksr ];
		SLOT->eg_sel_rr = eg_rate_select[SLOT->rr + SLOT->ksr ];
	}
}